

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O0

int Saig_MvSimHash(uint *pState,int nFlops,int TableSize)

{
  uint local_20;
  uint local_1c;
  int i;
  uint uHash;
  int TableSize_local;
  int nFlops_local;
  uint *pState_local;
  
  local_1c = 0;
  for (local_20 = 0; (int)local_20 < nFlops; local_20 = local_20 + 1) {
    local_1c = pState[(int)local_20] * Saig_MvSimHash::s_SPrimes[(int)(local_20 & 0xf)] ^ local_1c;
  }
  return local_1c % (uint)TableSize;
}

Assistant:

int Saig_MvSimHash( unsigned * pState, int nFlops, int TableSize )
{
    static int s_SPrimes[16] = { 
     1610612741,
     805306457,
     402653189,
     201326611,
     100663319,
     50331653,
     25165843,
     12582917,
     6291469,
     3145739,
     1572869,
     786433,
     393241,
     196613,
     98317,
     49157
    };
    unsigned uHash = 0;
    int i;
    for ( i = 0; i < nFlops; i++ )
        uHash ^= pState[i] * s_SPrimes[i & 0xF];
    return (int)(uHash % TableSize);
}